

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASValue.cpp
# Opt level: O2

void __thiscall ASValue::addUser(ASValue *this,uint idx,ASValue *user)

{
  uint local_c;
  ASValue *local_8;
  
  local_c = idx;
  local_8 = user;
  std::__cxx11::list<ASUse,std::allocator<ASUse>>::emplace_back<ASValue*&,unsigned_int&>
            ((list<ASUse,std::allocator<ASUse>> *)&this->_use,&local_8,&local_c);
  return;
}

Assistant:

void ASValue::addUser(unsigned int idx, ASValue *user) { _use.emplace_back(user, idx); }